

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator=
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *other)

{
  const_iterator first;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_RSI;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_RDI;
  size_type unaff_retaddr;
  InnerIt in_stack_00000008;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffffc0;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffffe0;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *pMVar1;
  
  if (in_RDI != in_RSI) {
    pMVar1 = in_RDI;
    clear(in_RSI);
    begin(in_stack_ffffffffffffffc0);
    end(in_stack_ffffffffffffffc0);
    first.it_.m_ = (InnerMap *)pMVar1;
    first.it_.node_ = (Node *)in_RSI;
    first.it_.bucket_index_ = unaff_retaddr;
    Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::
    insert<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::const_iterator>
              (in_stack_ffffffffffffffe0,first,(const_iterator)in_stack_00000008);
  }
  return in_RDI;
}

Assistant:

Map& operator=(const Map& other) {
    if (this != &other) {
      clear();
      insert(other.begin(), other.end());
    }
    return *this;
  }